

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_rolemaskproxymodel.cpp
# Opt level: O2

void __thiscall tst_RoleMaskProxyModel::testItemDataTransParent(tst_RoleMaskProxyModel *this)

{
  bool bVar1;
  char cVar2;
  int iVar3;
  QStandardItemModel *this_00;
  ModelTest *this_01;
  longlong lVar4;
  QMap<int,_QVariant> itemData;
  anon_union_24_3_e3d07ef4_for_data local_b0;
  int local_8c;
  anon_union_24_3_e3d07ef4_for_data local_88;
  undefined8 local_70;
  RoleMaskProxyModel proxyModel;
  QModelIndex proxyIdx;
  QModelIndex baseIdx;
  
  this_00 = (QStandardItemModel *)operator_new(0x10);
  QStandardItemModel::QStandardItemModel(this_00,&this->super_QObject);
  local_b0._forAlignment = -NAN;
  local_b0._8_8_ = 0;
  local_b0._16_8_ = 0;
  (**(code **)(*(long *)this_00 + 0xf8))(this_00,0,1,&local_b0);
  local_b0._forAlignment = -NAN;
  local_b0._8_8_ = 0;
  local_b0._16_8_ = 0;
  (**(code **)(*(long *)this_00 + 0x100))(this_00,0,1,&local_b0);
  local_b0._forAlignment = -NAN;
  local_b0._8_8_ = 0;
  local_b0._16_8_ = 0;
  (**(code **)(*(long *)this_00 + 0x60))(&baseIdx,this_00,0,0,&local_b0);
  QVariant::QVariant((QVariant *)&local_b0,1);
  bVar1 = (bool)(**(code **)(*(long *)this_00 + 0x98))(this_00,&baseIdx,&local_b0,0x100);
  cVar2 = QTest::qVerify(bVar1,"baseModel->setData(baseIdx, 1, Qt::UserRole)","",
                         "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                         ,0x4f);
  QVariant::~QVariant((QVariant *)&local_b0);
  if (cVar2 != '\0') {
    QVariant::QVariant((QVariant *)&local_b0,2);
    bVar1 = (bool)(**(code **)(*(long *)this_00 + 0x98))(this_00,&baseIdx,&local_b0,0x101);
    cVar2 = QTest::qVerify(bVar1,"baseModel->setData(baseIdx, 2, Qt::UserRole + 1)","",
                           "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                           ,0x50);
    QVariant::~QVariant((QVariant *)&local_b0);
    if (cVar2 != '\0') {
      (**(code **)(*(long *)this_00 + 0xb0))(&itemData,this_00,&baseIdx);
      if (itemData.d.d ==
          (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
           *)0x0) {
        lVar4 = 0;
      }
      else {
        lVar4 = *(longlong *)((long)itemData.d.d + 0x30);
      }
      cVar2 = QTest::qCompare(lVar4,2,"itemData.size()","2",
                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                              ,0x52);
      if (cVar2 != '\0') {
        _proxyModel = 0x100;
        local_88.shared = (PrivateShared *)0x0;
        local_88._8_8_ = 0;
        local_88._16_8_ = 0;
        local_70 = 2;
        QMap<int,_QVariant>::value
                  ((QVariant *)&local_b0,&itemData,(int *)&proxyModel,(QVariant *)&local_88);
        iVar3 = QVariant::toInt((bool *)local_b0.data);
        cVar2 = QTest::qCompare(iVar3,1,"itemData.value(Qt::UserRole).toInt()","1",
                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                ,0x53);
        QVariant::~QVariant((QVariant *)&local_b0);
        QVariant::~QVariant((QVariant *)&local_88);
        if (cVar2 != '\0') {
          _proxyModel = 0x101;
          local_88.shared = (PrivateShared *)0x0;
          local_88._8_8_ = 0;
          local_88._16_8_ = 0;
          local_70 = 2;
          QMap<int,_QVariant>::value
                    ((QVariant *)&local_b0,&itemData,(int *)&proxyModel,(QVariant *)&local_88);
          iVar3 = QVariant::toInt((bool *)local_b0.data);
          cVar2 = QTest::qCompare(iVar3,2,"itemData.value(Qt::UserRole + 1).toInt()","2",
                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                  ,0x54);
          QVariant::~QVariant((QVariant *)&local_b0);
          QVariant::~QVariant((QVariant *)&local_88);
          if (cVar2 != '\0') {
            RoleMaskProxyModel::RoleMaskProxyModel(&proxyModel,(QObject *)0x0);
            this_01 = (ModelTest *)operator_new(0x10);
            ModelTest::ModelTest(this_01,(QAbstractItemModel *)&proxyModel,(QObject *)this_00);
            RoleMaskProxyModel::setSourceModel((QAbstractItemModel *)&proxyModel);
            RoleMaskProxyModel::addMaskedRole((int)&proxyModel);
            RoleMaskProxyModel::addMaskedRole((int)&proxyModel);
            local_b0._forAlignment = -NAN;
            local_b0._8_8_ = 0;
            local_b0._16_8_ = 0;
            QIdentityProxyModel::index((int)&proxyIdx,(int)&proxyModel,(QModelIndex *)0x0);
            QVariant::QVariant((QVariant *)&local_b0,200);
            bVar1 = (bool)RoleMaskProxyModel::setData
                                    ((QModelIndex *)&proxyModel,(QVariant *)&proxyIdx,(int)&local_b0
                                    );
            cVar2 = QTest::qVerify(bVar1,"proxyModel.setData(proxyIdx, 200, Qt::UserRole + 2)","",
                                   "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                   ,0x5b);
            QVariant::~QVariant((QVariant *)&local_b0);
            if (cVar2 != '\0') {
              RoleMaskProxyModel::setTransparentIfEmpty(SUB81(&proxyModel,0));
              RoleMaskProxyModel::itemData((QModelIndex *)&local_b0);
              QtPrivate::
              QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
              ::operator=(&itemData.d,
                          (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                           *)&local_b0.shared);
              QtPrivate::
              QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
              ::~QExplicitlySharedDataPointerV2
                        ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                          *)&local_b0.shared);
              if (itemData.d.d ==
                  (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                   *)0x0) {
                lVar4 = 0;
              }
              else {
                lVar4 = *(longlong *)((long)itemData.d.d + 0x30);
              }
              cVar2 = QTest::qCompare(lVar4,3,"itemData.size()","3",
                                      "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                      ,0x5e);
              if (cVar2 != '\0') {
                local_8c = 0x100;
                local_88.shared = (PrivateShared *)0x0;
                local_88._8_8_ = 0;
                local_88._16_8_ = 0;
                local_70 = 2;
                QMap<int,_QVariant>::value
                          ((QVariant *)&local_b0,&itemData,&local_8c,(QVariant *)&local_88);
                iVar3 = QVariant::toInt((bool *)local_b0.data);
                cVar2 = QTest::qCompare(iVar3,1,"itemData.value(Qt::UserRole).toInt()","1",
                                        "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                        ,0x5f);
                QVariant::~QVariant((QVariant *)&local_b0);
                QVariant::~QVariant((QVariant *)&local_88);
                if (cVar2 != '\0') {
                  local_8c = 0x102;
                  local_88.shared = (PrivateShared *)0x0;
                  local_88._8_8_ = 0;
                  local_88._16_8_ = 0;
                  local_70 = 2;
                  QMap<int,_QVariant>::value
                            ((QVariant *)&local_b0,&itemData,&local_8c,(QVariant *)&local_88);
                  iVar3 = QVariant::toInt((bool *)local_b0.data);
                  cVar2 = QTest::qCompare(iVar3,200,"itemData.value(Qt::UserRole + 2).toInt()","200"
                                          ,
                                          "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                          ,0x60);
                  QVariant::~QVariant((QVariant *)&local_b0);
                  QVariant::~QVariant((QVariant *)&local_88);
                  if (cVar2 != '\0') {
                    local_8c = 0x101;
                    local_88.shared = (PrivateShared *)0x0;
                    local_88._8_8_ = 0;
                    local_88._16_8_ = 0;
                    local_70 = 2;
                    QMap<int,_QVariant>::value
                              ((QVariant *)&local_b0,&itemData,&local_8c,(QVariant *)&local_88);
                    iVar3 = QVariant::toInt((bool *)local_b0.data);
                    cVar2 = QTest::qCompare(iVar3,2,"itemData.value(Qt::UserRole + 1).toInt()","2",
                                            "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                            ,0x61);
                    QVariant::~QVariant((QVariant *)&local_b0);
                    QVariant::~QVariant((QVariant *)&local_88);
                    if (cVar2 != '\0') {
                      RoleMaskProxyModel::setTransparentIfEmpty(SUB81(&proxyModel,0));
                      RoleMaskProxyModel::itemData((QModelIndex *)&local_b0);
                      QtPrivate::
                      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      ::operator=(&itemData.d,
                                  (QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                                   *)&local_b0.shared);
                      QtPrivate::
                      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                      ::~QExplicitlySharedDataPointerV2
                                ((QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
                                  *)&local_b0.shared);
                      if (itemData.d.d ==
                          (QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>
                           *)0x0) {
                        lVar4 = 0;
                      }
                      else {
                        lVar4 = *(longlong *)((long)itemData.d.d + 0x30);
                      }
                      cVar2 = QTest::qCompare(lVar4,2,"itemData.size()","2",
                                              "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                              ,100);
                      if (cVar2 != '\0') {
                        local_8c = 0x100;
                        local_88.shared = (PrivateShared *)0x0;
                        local_88._8_8_ = 0;
                        local_88._16_8_ = 0;
                        local_70 = 2;
                        QMap<int,_QVariant>::value
                                  ((QVariant *)&local_b0,&itemData,&local_8c,(QVariant *)&local_88);
                        iVar3 = QVariant::toInt((bool *)local_b0.data);
                        cVar2 = QTest::qCompare(iVar3,1,"itemData.value(Qt::UserRole).toInt()","1",
                                                "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                ,0x65);
                        QVariant::~QVariant((QVariant *)&local_b0);
                        QVariant::~QVariant((QVariant *)&local_88);
                        if (cVar2 != '\0') {
                          local_8c = 0x102;
                          local_88.shared = (PrivateShared *)0x0;
                          local_88._8_8_ = 0;
                          local_88._16_8_ = 0;
                          local_70 = 2;
                          QMap<int,_QVariant>::value
                                    ((QVariant *)&local_b0,&itemData,&local_8c,(QVariant *)&local_88
                                    );
                          iVar3 = QVariant::toInt((bool *)local_b0.data);
                          cVar2 = QTest::qCompare(iVar3,200,
                                                  "itemData.value(Qt::UserRole + 2).toInt()","200",
                                                  "/workspace/llm4binary/github/license_c_cmakelists/VSRonin[P]QtModelUtilities/tests/tst_RoleMaskProxyModel/tst_rolemaskproxymodel.cpp"
                                                  ,0x66);
                          QVariant::~QVariant((QVariant *)&local_b0);
                          QVariant::~QVariant((QVariant *)&local_88);
                          if (cVar2 != '\0') {
                            QObject::deleteLater();
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
            RoleMaskProxyModel::~RoleMaskProxyModel(&proxyModel);
          }
        }
      }
      QtPrivate::
      QExplicitlySharedDataPointerV2<QMapData<std::map<int,_QVariant,_std::less<int>,_std::allocator<std::pair<const_int,_QVariant>_>_>_>_>
      ::~QExplicitlySharedDataPointerV2(&itemData.d);
    }
  }
  return;
}

Assistant:

void tst_RoleMaskProxyModel::testItemDataTransParent()
{
#ifdef COMPLEX_MODEL_SUPPORT
    QAbstractItemModel *baseModel = new ComplexModel(this);
    baseModel->insertRow(0);
    baseModel->insertColumn(0);
    const QModelIndex baseIdx = baseModel->index(0, 0);
    QVERIFY(baseModel->setData(baseIdx, 1, Qt::UserRole));
    QVERIFY(baseModel->setData(baseIdx, 2, Qt::UserRole + 1));
    auto itemData = baseModel->itemData(baseIdx);
    QCOMPARE(itemData.size(), 2);
    QCOMPARE(itemData.value(Qt::UserRole).toInt(), 1);
    QCOMPARE(itemData.value(Qt::UserRole + 1).toInt(), 2);
    RoleMaskProxyModel proxyModel;
    new ModelTest(&proxyModel, baseModel);
    proxyModel.setSourceModel(baseModel);
    proxyModel.addMaskedRole(Qt::UserRole + 1);
    proxyModel.addMaskedRole(Qt::UserRole + 2);
    const QModelIndex proxyIdx = proxyModel.index(0, 0);
    QVERIFY(proxyModel.setData(proxyIdx, 200, Qt::UserRole + 2));
    proxyModel.setTransparentIfEmpty(true);
    itemData = proxyModel.itemData(proxyIdx);
    QCOMPARE(itemData.size(), 3);
    QCOMPARE(itemData.value(Qt::UserRole).toInt(), 1);
    QCOMPARE(itemData.value(Qt::UserRole + 2).toInt(), 200);
    QCOMPARE(itemData.value(Qt::UserRole + 1).toInt(), 2);
    proxyModel.setTransparentIfEmpty(false);
    itemData = proxyModel.itemData(proxyIdx);
    QCOMPARE(itemData.size(), 2);
    QCOMPARE(itemData.value(Qt::UserRole).toInt(), 1);
    QCOMPARE(itemData.value(Qt::UserRole + 2).toInt(), 200);
    baseModel->deleteLater();
#else
    QSKIP("This test requires the Qt GUI or GenericModel modules");
#endif
}